

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

ExprBase ** __thiscall
SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>::
find(SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
     *this,TypedFunctionInstanceRequest *key)

{
  Node *pNVar1;
  TypeBase *pTVar2;
  SynBase *pSVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  uVar4 = this->bucketCount;
  uVar5 = uVar4 - 1;
  if (uVar4 != 0) {
    uVar6 = key->hash;
    pNVar1 = this->data;
    iVar7 = 0;
    do {
      uVar6 = uVar6 & uVar5;
      pTVar2 = pNVar1[uVar6].key.instanceType;
      pSVar3 = pNVar1[uVar6].key.syntax;
      if (pTVar2 == (TypeBase *)0x0 && pSVar3 == (SynBase *)0x0) {
        return (ExprBase **)0x0;
      }
      if ((pTVar2 == key->instanceType) && (pSVar3 == key->syntax)) {
        return &pNVar1[uVar6].value;
      }
      uVar6 = uVar6 + iVar7 + 1;
      iVar7 = iVar7 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return (ExprBase **)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}